

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGlaOld.c
# Opt level: O3

void Gia_ManRefSetAndPropFanout_rec(Gla_Man_t *p,Gia_Obj_t *pObj,int f,Vec_Int_t *vSelect,int Sign)

{
  Gia_Obj_t *pGVar1;
  Vec_Int_t *pVVar2;
  int *piVar3;
  Gia_Obj_t *pGVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  Gia_Man_t *pGVar9;
  ulong uVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  char *__function;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  uint uVar14;
  Vec_Int_t *pVVar15;
  Gia_Obj_t *pGVar16;
  char *__file;
  char *__assertion;
  ulong uVar17;
  long lVar18;
  int iVar19;
  
  uVar10 = (ulong)(uint)f;
  uVar17 = (ulong)(uint)f;
  while( true ) {
    pGVar16 = p->pGia->pObjs;
    if ((pObj < pGVar16) || (pGVar16 + p->pGia->nObjs <= pObj)) goto LAB_00587e79;
    pVVar15 = p->pvRefis + (int)((ulong)((long)pObj - (long)pGVar16) >> 2) * -0x55555555;
    iVar6 = (int)uVar17;
    uVar14 = iVar6 + 1;
    Vec_IntFillExtra(pVVar15,uVar14,(int)uVar10);
    if ((f < 0) || (pVVar15->nSize <= iVar6)) goto LAB_00587e98;
    uVar13 = pVVar15->pArray[uVar17];
    if ((uVar13 >> 0x13 & 0xfff) != Sign) {
      return;
    }
    if ((uVar13 & 2) != 0) {
      __assert_fail("pRef->fVisit == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absGlaOld.c"
                    ,0x126,
                    "void Gia_ManRefSetAndPropFanout_rec(Gla_Man_t *, Gia_Obj_t *, int, Vec_Int_t *, int)"
                   );
    }
    uVar10 = (ulong)(uVar13 | 2);
    pVVar15->pArray[uVar17] = uVar13 | 2;
    if ((uVar13 & 4) != 0) {
      if ((uVar13 & 0x7fff8) == 0) {
        __assert_fail("(int)pRef->Prio > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absGlaOld.c"
                      ,0x12a,
                      "void Gia_ManRefSetAndPropFanout_rec(Gla_Man_t *, Gia_Obj_t *, int, Vec_Int_t *, int)"
                     );
      }
      lVar18 = (long)p->pPars->iFrame;
      if (-1 < lVar18) goto LAB_00587a8e;
      goto LAB_00587b26;
    }
    uVar10 = *(ulong *)pObj;
    uVar13 = (uint)uVar10;
    if (((uVar10 & 0x1fffffff) != 0x1fffffff && (int)uVar13 < 0) && (iVar6 == p->pPars->iFrame)) {
      return;
    }
    pGVar9 = p->pGia;
    iVar12 = (int)(uVar10 & 0x1fffffff);
    uVar11 = (uint)(uVar10 >> 0x20);
    if ((-1 < (int)uVar13) || (iVar12 == 0x1fffffff)) break;
    uVar11 = uVar11 & 0x1fffffff;
    iVar12 = pGVar9->vCos->nSize;
    if ((int)uVar11 < iVar12 - pGVar9->nRegs) {
      return;
    }
    iVar19 = pGVar9->vCis->nSize;
    uVar11 = (iVar19 - iVar12) + uVar11;
    if (((int)uVar11 < 0) || (iVar19 <= (int)uVar11)) goto LAB_00587eaf;
    iVar12 = pGVar9->vCis->pArray[uVar11];
    lVar18 = (long)iVar12;
    if ((lVar18 < 0) || (pGVar9->nObjs <= iVar12)) goto LAB_00587ece;
    pGVar16 = pGVar9->pObjs;
    pVVar2 = p->pvRefis;
    pVVar15 = pVVar2 + lVar18;
    Vec_IntFillExtra(pVVar15,iVar6 + 2,uVar11);
    if (pVVar2[lVar18].nSize <= (int)uVar14) goto LAB_00587e98;
    pObj = pGVar16 + lVar18;
    uVar17 = (ulong)uVar14;
    uVar10 = extraout_RDX;
    if ((*(byte *)(pVVar15->pArray + uVar14) & 2) != 0) {
      return;
    }
  }
  if ((~uVar13 & 0x9fffffff) == 0) {
    if (((int)uVar13 < 0 || iVar12 == 0x1fffffff) &&
       ((int)(uVar11 & 0x1fffffff) < pGVar9->vCis->nSize - pGVar9->nRegs)) {
LAB_00587f4a:
      __assert_fail("Gia_ObjIsRo(p->pGia, pObj) || Gia_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absGlaOld.c"
                    ,0x13a,
                    "void Gia_ManRefSetAndPropFanout_rec(Gla_Man_t *, Gia_Obj_t *, int, Vec_Int_t *, int)"
                   );
    }
  }
  else if (((int)uVar13 < 0) || (iVar12 == 0x1fffffff)) goto LAB_00587f4a;
  pGVar16 = pGVar9->pObjs;
  if (pGVar16 <= pObj) {
    iVar12 = iVar6 + 1;
    iVar19 = 0;
    while (pObj < pGVar16 + pGVar9->nObjs) {
      uVar14 = (int)((long)pObj - (long)pGVar16 >> 2) * -0x55555555;
      if (((int)uVar14 < 0) || (pGVar9->vFanoutNums->nSize <= (int)uVar14)) {
LAB_00587eaf:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if (pGVar9->vFanoutNums->pArray[uVar14 & 0x7fffffff] <= iVar19) {
        return;
      }
      uVar13 = pGVar9->vFanout->nSize;
      if ((int)uVar13 <= (int)uVar14) goto LAB_00587eaf;
      piVar3 = pGVar9->vFanout->pArray;
      uVar14 = piVar3[uVar14 & 0x7fffffff] + iVar19;
      if (((int)uVar14 < 0) || (uVar13 <= uVar14)) goto LAB_00587eaf;
      iVar7 = piVar3[uVar14];
      lVar18 = (long)iVar7;
      if ((lVar18 < 0) || (pGVar9->nObjs <= iVar7)) goto LAB_00587ece;
      pVVar2 = p->pvRefis;
      pVVar15 = pVVar2 + lVar18;
      Vec_IntFillExtra(pVVar15,iVar12,uVar14);
      if (pVVar2[lVar18].nSize <= iVar6) goto LAB_00587e98;
      if ((*(byte *)(pVVar15->pArray + uVar17) & 2) == 0) {
        pGVar16 = pGVar16 + lVar18;
        iVar7 = (int)*(ulong *)pGVar16;
        uVar10 = *(ulong *)pGVar16 & 0x1fffffff;
        if (-1 < iVar7 || uVar10 == 0x1fffffff) {
          if ((iVar7 < 0) || ((int)uVar10 == 0x1fffffff)) {
            __assert_fail("Gia_ObjIsAnd(pFanout)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absGlaOld.c"
                          ,0x145,
                          "void Gia_ManRefSetAndPropFanout_rec(Gla_Man_t *, Gia_Obj_t *, int, Vec_Int_t *, int)"
                         );
          }
          pGVar1 = pGVar16 + -uVar10;
          pGVar4 = p->pGia->pObjs;
          if ((pGVar1 < pGVar4) || (pGVar4 + p->pGia->nObjs <= pGVar1)) break;
          pVVar2 = p->pvRefis;
          iVar7 = (int)((ulong)((long)pGVar1 - (long)pGVar4) >> 2) * -0x55555555;
          pVVar15 = pVVar2 + iVar7;
          Vec_IntFillExtra(pVVar15,iVar12,(int)(pGVar4 + p->pGia->nObjs));
          if (pVVar2[iVar7].nSize <= iVar6) goto LAB_00587e98;
          pGVar1 = pGVar16 + -(ulong)(*(uint *)&pGVar16->field_0x4 & 0x1fffffff);
          pGVar4 = p->pGia->pObjs;
          if ((pGVar1 < pGVar4) || (pGVar4 + p->pGia->nObjs <= pGVar1)) break;
          piVar3 = pVVar15->pArray;
          pVVar2 = p->pvRefis;
          iVar7 = (int)((ulong)((long)pGVar1 - (long)pGVar4) >> 2) * -0x55555555;
          pVVar15 = pVVar2 + iVar7;
          Vec_IntFillExtra(pVVar15,iVar12,(int)p);
          if (pVVar2[iVar7].nSize <= iVar6) goto LAB_00587e98;
          uVar14 = piVar3[uVar17];
          uVar13 = ((uint)(*(ulong *)pGVar16 >> 0x1d) & 7 ^ uVar14) & 1;
          uVar14 = uVar14 & 2;
          if ((uVar14 == 0) || (uVar13 != 0)) {
            uVar11 = pVVar15->pArray[uVar17];
            uVar8 = (uint)(*(ulong *)pGVar16 >> 0x3d) ^ uVar11;
            if ((((uVar11 & 2) == 0) || ((uVar8 & 1) != 0)) &&
               (((uVar14 & uVar11) == 0 || ((uVar13 & uVar8) == 0)))) goto LAB_00587e60;
          }
        }
        Gia_ManRefSetAndPropFanout_rec(p,pGVar16,iVar6,vSelect,Sign);
      }
LAB_00587e60:
      iVar19 = iVar19 + 1;
      pGVar9 = p->pGia;
      pGVar16 = pGVar9->pObjs;
      if (pObj < pGVar16) break;
    }
  }
LAB_00587e79:
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
  while( true ) {
    pVVar2 = p->pvRefis;
    iVar6 = (int)((ulong)((long)pObj - (long)pGVar16) >> 2) * -0x55555555;
    pVVar15 = pVVar2 + iVar6;
    Vec_IntFillExtra(pVVar15,(int)lVar18 + 1,(int)uVar10);
    if (pVVar2[iVar6].nSize <= lVar18) goto LAB_00587e98;
    uVar10 = extraout_RDX_00;
    if ((*(byte *)(pVVar15->pArray + lVar18) & 2) == 0) {
      Gia_ManRefSetAndPropFanout_rec(p,pObj,(int)lVar18,vSelect,Sign);
      uVar10 = extraout_RDX_01;
    }
    bVar5 = lVar18 < 1;
    lVar18 = lVar18 + -1;
    if (bVar5) break;
LAB_00587a8e:
    pGVar16 = p->pGia->pObjs;
    if ((pObj < pGVar16) || (pGVar16 + p->pGia->nObjs <= pObj)) goto LAB_00587e79;
  }
LAB_00587b26:
  pGVar16 = p->pGia->pObjs;
  if ((pGVar16 <= pObj) && (pObj < pGVar16 + p->pGia->nObjs)) {
    Vec_IntPush(vSelect,(int)((ulong)((long)pObj - (long)pGVar16) >> 2) * -0x55555555);
    return;
  }
  goto LAB_00587e79;
LAB_00587ece:
  __assertion = "v >= 0 && v < p->nObjs";
  __file = 
  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h";
  __function = "Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)";
  goto LAB_00587ee3;
LAB_00587e98:
  __assertion = "i >= 0 && i < p->nSize";
  __file = 
  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
  ;
  __function = "int *Vec_IntEntryP(Vec_Int_t *, int)";
LAB_00587ee3:
  __assert_fail(__assertion,__file,0x1af,__function);
}

Assistant:

void Gia_ManRefSetAndPropFanout_rec( Gla_Man_t * p, Gia_Obj_t * pObj, int f, Vec_Int_t * vSelect, int Sign )
{
    int i;//, Id = Gia_ObjId(p->pGia, pObj);
    Rfn_Obj_t * pRef0, * pRef1, * pRef = Gla_ObjRef( p, pObj, f );
    Gia_Obj_t * pFanout;
    int k;
    if ( (int)pRef->Sign != Sign )
        return;
    assert( pRef->fVisit == 0 );
    pRef->fVisit = 1;
    if ( pRef->fPPi )
    {
        assert( (int)pRef->Prio > 0 );
        for ( i = p->pPars->iFrame; i >= 0; i-- )
            if ( !Gla_ObjRef(p, pObj, i)->fVisit )
                Gia_ManRefSetAndPropFanout_rec( p, pObj, i, vSelect, Sign );
        Vec_IntPush( vSelect, Gia_ObjId(p->pGia, pObj) );
        return;
    }
    if ( (Gia_ObjIsCo(pObj) && f == p->pPars->iFrame) || Gia_ObjIsPo(p->pGia, pObj) )
        return;
    if ( Gia_ObjIsRi(p->pGia, pObj) )
    {
        pFanout = Gia_ObjRiToRo(p->pGia, pObj);
        if ( !Gla_ObjRef(p, pFanout, f+1)->fVisit )
            Gia_ManRefSetAndPropFanout_rec( p, pFanout, f+1, vSelect, Sign );
        return;
    }
    assert( Gia_ObjIsRo(p->pGia, pObj) || Gia_ObjIsAnd(pObj) );
    Gia_ObjForEachFanoutStatic( p->pGia, pObj, pFanout, k )
    {
//        Rfn_Obj_t * pRefF = Gla_ObjRef(p, pFanout, f);
        if ( Gla_ObjRef(p, pFanout, f)->fVisit )
            continue;
        if ( Gia_ObjIsCo(pFanout) )
        {
            Gia_ManRefSetAndPropFanout_rec( p, pFanout, f, vSelect, Sign );
            continue;
        } 
        assert( Gia_ObjIsAnd(pFanout) );
        pRef0 = Gla_ObjRef( p, Gia_ObjFanin0(pFanout), f );
        pRef1 = Gla_ObjRef( p, Gia_ObjFanin1(pFanout), f );
        if ( ((pRef0->Value ^ Gia_ObjFaninC0(pFanout)) == 0 && pRef0->fVisit) ||
             ((pRef1->Value ^ Gia_ObjFaninC1(pFanout)) == 0 && pRef1->fVisit) || 
           ( ((pRef0->Value ^ Gia_ObjFaninC0(pFanout)) == 1 && pRef0->fVisit) && 
             ((pRef1->Value ^ Gia_ObjFaninC1(pFanout)) == 1 && pRef1->fVisit) ) )
           Gia_ManRefSetAndPropFanout_rec( p, pFanout, f, vSelect, Sign );
    }
}